

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

void __thiscall httplib::ThreadPool::enqueue(ThreadPool *this,function<void_()> *fn)

{
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> local_20;
  
  std::unique_lock<std::mutex>::unique_lock(&local_20,&this->mutex_);
  std::__cxx11::list<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::push_back
            (&this->jobs_,fn);
  std::condition_variable::notify_one();
  std::unique_lock<std::mutex>::~unique_lock(&local_20);
  return;
}

Assistant:

void enqueue(std::function<void()> fn) override {
    std::unique_lock<std::mutex> lock(mutex_);
    jobs_.push_back(fn);
    cond_.notify_one();
  }